

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaTargetGenerator.cxx
# Opt level: O2

bool __thiscall cmNinjaTargetGenerator::ForceResponseFile(cmNinjaTargetGenerator *this)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  allocator local_9;
  
  if (ForceResponseFile()::forceRspFile_abi_cxx11_ == '\0') {
    iVar3 = __cxa_guard_acquire(&ForceResponseFile()::forceRspFile_abi_cxx11_);
    if (iVar3 != 0) {
      std::__cxx11::string::string
                ((string *)&ForceResponseFile()::forceRspFile_abi_cxx11_,
                 "CMAKE_NINJA_FORCE_RESPONSE_FILE",&local_9);
      __cxa_atexit(std::__cxx11::string::~string,&ForceResponseFile()::forceRspFile_abi_cxx11_,
                   &__dso_handle);
      __cxa_guard_release(&ForceResponseFile()::forceRspFile_abi_cxx11_);
    }
  }
  bVar1 = cmMakefile::IsDefinitionSet
                    ((this->super_cmCommonTargetGenerator).Makefile,
                     &ForceResponseFile()::forceRspFile_abi_cxx11_);
  bVar2 = true;
  if (!bVar1) {
    bVar2 = cmsys::SystemTools::HasEnv(&ForceResponseFile()::forceRspFile_abi_cxx11_);
  }
  return bVar2;
}

Assistant:

bool cmNinjaTargetGenerator::ForceResponseFile()
{
  static std::string const forceRspFile = "CMAKE_NINJA_FORCE_RESPONSE_FILE";
  return (this->GetMakefile()->IsDefinitionSet(forceRspFile) ||
          cmSystemTools::HasEnv(forceRspFile));
}